

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void writeFileStackNode(FileStackNode *node,FILE *f)

{
  uint32_t local_28;
  uint local_24;
  uint32_t i;
  FileStackReptNode *reptNode;
  FILE *f_local;
  FileStackNode *node_local;
  
  if (node->parent == (FileStackNode *)0x0) {
    local_28 = 0xffffffff;
  }
  else {
    local_28 = node->parent->ID;
  }
  putlong(local_28,f);
  putlong(node->lineNo,f);
  putc(node->type,(FILE *)f);
  if (node->type == NODE_REPT) {
    putlong(*(uint32_t *)&node[1].parent,f);
    local_24 = *(uint *)&node[1].parent;
    while (local_24 != 0) {
      putlong(*(uint32_t *)((long)&node[1].parent + (ulong)(local_24 - 1) * 4 + 4),f);
      local_24 = local_24 - 1;
    }
  }
  else {
    putstring((char *)(node + 1),f);
  }
  return;
}

Assistant:

static void writeFileStackNode(struct FileStackNode const *node, FILE *f)
{
	putlong(node->parent ? node->parent->ID : (uint32_t)-1, f);
	putlong(node->lineNo, f);
	putc(node->type, f);
	if (node->type != NODE_REPT) {
		putstring(((struct FileStackNamedNode const *)node)->name, f);
	} else {
		struct FileStackReptNode const *reptNode = (struct FileStackReptNode const *)node;

		putlong(reptNode->reptDepth, f);
		// Iters are stored by decreasing depth, so reverse the order for output
		for (uint32_t i = reptNode->reptDepth; i--; )
			putlong(reptNode->iters[i], f);
	}
}